

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O0

long do_single_probe(CMConnection conn,long size,attr_list attrs)

{
  int iVar1;
  __pid_t _Var2;
  char *pcVar3;
  long lVar4;
  pthread_t pVar5;
  size_t in_RSI;
  long *in_RDI;
  double dVar6;
  timespec ts_1;
  timespec ts;
  char *new_block_1;
  char *new_block;
  FFSEncodeVec tmp_vec [1];
  long actual;
  chr_time round_trip_time;
  int cond;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  void *in_stack_ffffffffffffff50;
  FILE *pFVar7;
  CMConnection in_stack_ffffffffffffff58;
  CManager in_stack_ffffffffffffff60;
  FILE *in_stack_ffffffffffffff68;
  FFSEncodeVector in_stack_ffffffffffffff70;
  CManager in_stack_ffffffffffffff78;
  CMConnection in_stack_ffffffffffffff80;
  undefined4 local_78;
  CMTraceType in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  chr_time local_40;
  int local_24;
  size_t local_18;
  long *local_10;
  long local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_24 = INT_CMCondition_get(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((long)local_18 < 0xc) {
    local_18 = 0xc;
  }
  if (do_single_probe::max_block_size == 0) {
    pcVar3 = (char *)INT_CMmalloc((size_t)in_stack_ffffffffffffff50);
    if (pcVar3 == (char *)0x0) {
      return -1;
    }
    do_single_probe::max_block_size = local_18;
    do_single_probe::block = pcVar3;
    memset(pcVar3,0xef,local_18);
  }
  else if (do_single_probe::max_block_size < (long)local_18) {
    pcVar3 = (char *)INT_CMrealloc(in_stack_ffffffffffffff50,
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (pcVar3 == (char *)0x0) {
      return -1;
    }
    do_single_probe::max_block_size = local_18;
    do_single_probe::block = pcVar3;
    memset(pcVar3,0xef,local_18);
  }
  pcVar3 = do_single_probe::block;
  pcVar3[0] = '\0';
  pcVar3[1] = 'P';
  pcVar3[2] = 'M';
  pcVar3[3] = 'C';
  *(uint *)(do_single_probe::block + 4) = (uint)(local_18 >> 0x20) & 0xffffff;
  *(int *)(do_single_probe::block + 8) = (int)local_18;
  *(int *)(do_single_probe::block + 0xc) = local_24;
  INT_CMCondition_set_client_data
            (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             in_stack_ffffffffffffff50);
  iVar1 = CMtrace_val[5];
  if (*(long *)(*local_10 + 0x120) == 0) {
    iVar1 = CMtrace_init((CManager)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff8c);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffff68 = *(FILE **)(*local_10 + 0x120);
      _Var2 = getpid();
      in_stack_ffffffffffffff70 = (FFSEncodeVector)(long)_Var2;
      pVar5 = pthread_self();
      fprintf(in_stack_ffffffffffffff68,"P%lxT%lx - ",in_stack_ffffffffffffff70,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&local_78);
      fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",
              CONCAT44(in_stack_ffffffffffffff8c,local_78),
              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    fprintf(*(FILE **)(*local_10 + 0x120),"CM - Initiating latency probe of %ld bytes\n",local_18);
  }
  fflush(*(FILE **)(*local_10 + 0x120));
  chr_timer_start((chr_time *)0x12f1f3);
  iVar1 = INT_CMwrite_raw(in_stack_ffffffffffffff80,(FFSEncodeVector)in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70,(long)in_stack_ffffffffffffff68,
                          (size_t)in_stack_ffffffffffffff60,(attr_list)in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff90);
  if (iVar1 == 1) {
    INT_CMCondition_wait(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    iVar1 = CMtrace_val[5];
    if (*(long *)(*local_10 + 0x120) == 0) {
      iVar1 = CMtrace_init((CManager)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff8c);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = *(FILE **)(*local_10 + 0x120);
        _Var2 = getpid();
        lVar4 = (long)_Var2;
        pVar5 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",lVar4,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffff78);
        fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff78,
                in_stack_ffffffffffffff80);
      }
      pFVar7 = *(FILE **)(*local_10 + 0x120);
      chr_time_to_microsecs(&local_40);
      fprintf(pFVar7,"CM - Completed latency probe - result %g microseconds\n");
    }
    fflush(*(FILE **)(*local_10 + 0x120));
    dVar6 = chr_time_to_microsecs(&local_40);
    local_8 = (long)dVar6;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

static long
do_single_probe(CMConnection conn, long size, attr_list attrs)
{
    int cond;
    static long max_block_size = 0;
    static char *block = NULL;
    chr_time round_trip_time;
    long actual;
    struct FFSEncodeVec tmp_vec[1];

    (void)attrs;
    cond = INT_CMCondition_get(conn->cm, conn);

    if (size < 12) size = 12;
    if (max_block_size == 0) {
	char *new_block = malloc(size);
	if (new_block == NULL) return -1;
	block = new_block;
	max_block_size = size;
	memset(block, 0xef, size);
    } else if (size > max_block_size) {
	char *new_block = realloc(block, size);
	if (new_block == NULL) return -1;
	block = new_block;
	max_block_size = size;
	memset(block, 0xef, size);
    }
    
    /* CMP\0 in first entry for CMPerformance message */
    ((int*)block)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
    ((int*)block)[1] = (size & 0xffffff) | (CMPerfProbe<<24);;
    ((int*)block)[2] = 0;
#else
    ((int*)block)[1] = (size >>32) & 0xffffff;
    ((int*)block)[2] = size;
#endif
    ((int*)block)[3] = cond;   /* condition value in fourth entry */
    
    INT_CMCondition_set_client_data( conn->cm, cond, &round_trip_time);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Initiating latency probe of %ld bytes\n", size);
    chr_timer_start(&round_trip_time);

    tmp_vec[0].iov_base = &block[0];
    tmp_vec[0].iov_len = size;
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, size, NULL, 0);

    if (actual != 1) return -1;

    INT_CMCondition_wait(conn->cm, cond);
    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Completed latency probe - result %g microseconds\n", chr_time_to_microsecs(&round_trip_time));
    return (long) chr_time_to_microsecs(&round_trip_time);
}